

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convTest.c
# Opt level: O2

void main(void)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  long M;
  float *data;
  float *data_00;
  FILE *__s;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t __nmemb;
  float *data1;
  char *__s_00;
  float *data2;
  long N;
  long kernSize;
  long dataSize;
  long N2;
  
  N2 = 2;
  kernSize = 0x3eb;
  dataSize = 0x416;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",0x309);
  srand(0x309);
  M = lround(11.0);
  bVar2 = (byte)M;
  N = 1L << (bVar2 & 0x3f);
  printf("fft size = %6ld,  ",N);
  iVar3 = fftInit(M);
  __nmemb = 2L << (bVar2 & 0x3f);
  data = (float *)calloc(__nmemb,4);
  if (data == (float *)0x0) {
    iVar3 = 2;
  }
  __s_00 = " out of memory ";
  if (iVar3 != 2) {
    if (iVar3 == 0) {
      data_00 = (float *)calloc(__nmemb,4);
      if (data_00 == (float *)0x0) goto LAB_001013c1;
      __s = fopen("convdat.cnv","wb");
      if (__s != (FILE *)0x0) {
        fwrite(&dataSize,8,1,__s);
        fwrite(&kernSize,8,1,__s);
        fwrite(&N2,8,1,__s);
        sVar1 = dataSize * 4;
        lVar5 = 0;
        lVar6 = dataSize;
        if (dataSize < 1) {
          lVar6 = lVar5;
        }
        for (; lVar5 != 2; lVar5 = lVar5 + 1) {
          for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
            iVar3 = rand();
            (data + (lVar5 << (bVar2 & 0x3f)))[lVar4] = (float)iVar3 * 9.313226e-10 + -1.0;
          }
          fwrite(data + (lVar5 << (bVar2 & 0x3f)),sVar1,1,__s);
        }
        sVar1 = kernSize * 4;
        lVar5 = 0;
        lVar6 = kernSize;
        if (kernSize < 1) {
          lVar6 = lVar5;
        }
        for (; lVar5 != 2; lVar5 = lVar5 + 1) {
          for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
            iVar3 = rand();
            (data_00 + (lVar5 << (bVar2 & 0x3f)))[lVar4] = (float)iVar3 * 9.313226e-10 + -1.0;
          }
          fwrite(data_00 + (lVar5 << (bVar2 & 0x3f)),sVar1,1,__s);
        }
        rffts(data,M,2);
        rffts(data_00,M,2);
        data1 = data;
        data2 = data_00;
        for (lVar6 = 0; lVar6 < (long)__nmemb; lVar6 = lVar6 + N) {
          rspectprod(data1,data2,data1,N);
          data1 = data1 + N;
          data2 = data2 + N;
        }
        riffts(data,M,2);
        fwrite(data,8L << (bVar2 & 0x3f),1,__s);
        fclose(__s);
        free(data_00);
        free(data);
        goto LAB_001013c9;
      }
    }
    __s_00 = " error ";
  }
LAB_001013c1:
  puts(__s_00);
LAB_001013c9:
  fftFree();
  puts(" Done. ");
  return;
}

Assistant:

void main(){
const long N2 = 2;		/* the number ffts to test */
long 	N = 2048;		/* size of FFTs, must be power of 2 */
long 	kernSize = 1003;	/* kernal size must be less than N */
long 	dataSize = N-kernSize+1;	/* data size */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);

printf("fft size = %6ld,  ",  N);

if (dataSize <= 0) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fftInit(M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("convdat.cnv", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&N2, sizeof(N2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}


	/* fast convolution of zero padded sequences */
	rffts(a, M, N2);
	rffts(b, M, N2);
	for (i2=0; i2<N2*N; i2+=N){
		rspectprod(&a[i2], &b[i2], &a[i2], N);
	}
	riffts(a, M, N2);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fftFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fftFree();
}
printf(" Done. \n");
return;
}